

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall
QPDFObjectHandle::mergeResources
          (QPDFObjectHandle *this,QPDFObjectHandle *other,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          *conflicts)

{
  _Atomic_word *p_Var1;
  _Rb_tree_node_base *key;
  _Base_ptr key_00;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  bool bVar6;
  __index_type _Var7;
  int iVar8;
  QPDF_Dictionary *pQVar9;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar10;
  _Rb_tree_node_base *p_Var11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  long lVar17;
  const_iterator cVar18;
  _Base_ptr p_Var19;
  undefined1 auVar20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Rb_tree_node_base *p_Var22;
  string *psVar23;
  T this_item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  mapped_type new_key;
  iterator __begin5;
  QPDFObjectHandle other_val;
  map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  og_to_name;
  QPDFObjGen rval_og;
  int min_suffix;
  QPDFObjectHandle local_168;
  QPDFObjectHandle local_158;
  BaseHandle local_148;
  string local_138;
  undefined1 local_118 [8];
  undefined1 auStack_110 [8];
  undefined1 local_108 [32];
  undefined1 local_e8 [8];
  undefined1 local_e0 [48];
  _Base_ptr local_b0;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  _Base_ptr local_98;
  QPDFObjGen local_90;
  QPDFObjGen local_88;
  size_t local_80;
  string *local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *local_70;
  key_type local_68;
  int local_5c;
  BaseHandle local_58;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_70 = conflicts;
  bVar5 = isDictionary(this);
  if ((bVar5) && (bVar5 = isDictionary(other), bVar5)) {
    local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (other->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (other->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_58);
    if (pQVar9 == (QPDF_Dictionary *)0x0) {
      p_Var19 = (_Base_ptr)0x0;
    }
    else {
      p_Var19 = (pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_58);
    local_40 = &(pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar9 == (QPDF_Dictionary *)0x0) {
      local_40 = (_Base_ptr)0x0;
    }
    psVar23 = (string *)this;
    if (p_Var19 != local_40) {
      do {
        local_78 = psVar23;
        local_e0._40_8_ = *(undefined8 *)(p_Var19 + 2);
        local_b0 = p_Var19[2]._M_parent;
        if (local_b0 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
          }
        }
        key_00 = p_Var19 + 1;
        bVar5 = hasKey(this,(string *)key_00);
        if (bVar5) {
          getKey(&local_158,(string *)this);
          bVar5 = isDictionary(&local_158);
          if ((bVar5) && (bVar5 = isDictionary((QPDFObjectHandle *)(local_e0 + 0x28)), bVar5)) {
            if ((local_158.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                 (element_type *)0x0) &&
               (((local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og).obj != 0))
            {
              shallowCopy((QPDFObjectHandle *)local_e8);
              replaceKeyAndGetNew((QPDFObjectHandle *)local_a8,(string *)this,
                                  (QPDFObjectHandle *)key_00);
              _Var4._M_pi = _Stack_a0._M_pi;
              local_158.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_a8;
              _Var21._M_pi = local_158.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi;
              local_a8 = (undefined1  [8])0x0;
              _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_158.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   _Var4._M_pi;
              if (((element_type *)_Var21._M_pi != (element_type *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi),
                 (element_type *)_Stack_a0._M_pi != (element_type *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_e0._4_4_,local_e0._0_4_) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_e0._4_4_,local_e0._0_4_));
              }
            }
            _Stack_a0._M_pi = _Stack_a0._M_pi & 0xffffffff00000000;
            local_98 = (_Base_ptr)0x0;
            local_90 = (QPDFObjGen)&_Stack_a0;
            local_80 = 0;
            local_e0._0_4_ = 0;
            local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e0._16_8_ = local_e0;
            local_e0._32_8_ = 0;
            local_5c = 1;
            local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_e0._40_8_;
            local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
            if (local_b0 != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
              }
            }
            local_e0._24_8_ = local_e0._16_8_;
            local_88 = local_90;
            pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_148);
            if (pQVar9 == (QPDF_Dictionary *)0x0) {
              p_Var16 = (_Base_ptr)0x0;
            }
            else {
              p_Var16 = (pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            local_48 = p_Var19;
            pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>(&local_148);
            local_38 = &(pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header;
            if (pQVar9 == (QPDF_Dictionary *)0x0) {
              local_38 = (_Base_ptr)0x0;
            }
            if (p_Var16 != local_38) {
              bVar5 = false;
              do {
                local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(element_type **)(p_Var16 + 2);
                local_168.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var16[2]._M_parent;
                if ((element_type *)
                    local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var1 = (_Atomic_word *)
                             ((long)&(((element_type *)
                                      local_168.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->value).
                                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             + 8);
                    *p_Var1 = *p_Var1 + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var1 = (_Atomic_word *)
                             ((long)&(((element_type *)
                                      local_168.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->value).
                                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     .
                                     super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             + 8);
                    *p_Var1 = *p_Var1 + 1;
                  }
                }
                key = p_Var16 + 1;
                bVar6 = hasKey(&local_158,(string *)key);
                if (bVar6) {
                  if (local_70 !=
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                       *)0x0) {
                    psVar23 = local_78;
                    if (!bVar5) {
                      local_118 = (undefined1  [8])
                                  local_158.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      auStack_110 = (undefined1  [8])
                                    local_158.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi;
                      if ((element_type *)
                          local_158.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi != (element_type *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_M_use_count =
                               (local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_118);
                      if (pQVar9 == (QPDF_Dictionary *)0x0) {
                        p_Var11 = (_Rb_tree_node_base *)0x0;
                      }
                      else {
                        p_Var11 = (pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left;
                      }
                      pQVar9 = ::qpdf::BaseHandle::as<QPDF_Dictionary>((BaseHandle *)local_118);
                      p_Var22 = &(pQVar9->items)._M_t._M_impl.super__Rb_tree_header._M_header;
                      if (pQVar9 == (QPDF_Dictionary *)0x0) {
                        p_Var22 = (_Rb_tree_node_base *)0x0;
                      }
                      for (; p_Var11 != p_Var22;
                          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                        __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                **)(p_Var11 + 2);
                        if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                    *)0x0) {
                          _Var7 = (__v->
                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  ).
                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  .
                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                  ._M_index;
                          if (_Var7 == '\x0f') {
                            pvVar10 = std::
                                      get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                                                (__v);
LAB_001c4084:
                            _Var7 = *(__index_type *)
                                     ((long)&(((pvVar10->obj).
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr)->value).
                                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                             .
                                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                             .
                                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                             .
                                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                     + 0x30);
                          }
                          else if (_Var7 == '\r') {
                            pvVar10 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                                       *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                                  *(QPDFObjGen *)
                                                   ((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x18));
                            goto LAB_001c4084;
                          }
                          if (((_Var7 != '\x02') && (*(long *)(p_Var11 + 2) != 0)) &&
                             (paVar2 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         **)(*(long *)(p_Var11 + 2) + 0x50), (int)paVar2 != 0)) {
                            local_138._M_dataplus._M_p = (pointer)paVar2;
                            std::
                            map<QPDFObjGen,std::__cxx11::string,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,std::__cxx11::string>>>
                            ::insert_or_assign<std::__cxx11::string_const&>
                                      ((map<QPDFObjGen,std::__cxx11::string,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,std::__cxx11::string>>>
                                        *)local_a8,(key_type *)&local_138,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var11 + 1));
                          }
                        }
                      }
                      if (auStack_110 != (undefined1  [8])0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_110);
                      }
                      getResourceNames_abi_cxx11_
                                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_118,&local_158);
                      psVar23 = local_78;
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_e8);
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._0_8_ !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        local_e0._0_4_ = auStack_110._0_4_;
                        local_e0._8_8_ = local_108._0_8_;
                        local_e0._16_8_ = local_108._8_8_;
                        local_e0._24_8_ = local_108._16_8_;
                        *(undefined1 **)(local_108._0_8_ + 8) = local_e0;
                        local_e0._32_8_ = local_108._24_8_;
                        local_108._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        local_108._8_8_ = auStack_110;
                        local_108._24_8_ = 0;
                        local_108._16_8_ = local_108._8_8_;
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_118);
                    }
                    if (local_168.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                        (element_type *)0x0) {
                      local_68.obj = 0;
                      local_68.gen = 0;
LAB_001c425d:
                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_138,*(long *)(p_Var16 + 1),
                                 (long)&(p_Var16[1]._M_parent)->_M_color + *(long *)(p_Var16 + 1));
                      std::__cxx11::string::append((char *)&local_138);
                      getUniqueResourceName
                                ((string *)local_118,(QPDFObjectHandle *)psVar23,&local_138,
                                 &local_5c,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_e8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                        operator_delete(local_138._M_dataplus._M_p,
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                      pmVar14 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                ::operator[](local_70,(key_type *)key_00);
                      pmVar15 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](pmVar14,(key_type *)key);
                      std::__cxx11::string::_M_assign((string *)pmVar15);
                      replaceKey(&local_158,(string *)local_118,&local_168);
                      auVar20 = local_118;
                      if (local_118 != (undefined1  [8])(auStack_110 + 8)) {
LAB_001c431a:
                        operator_delete((void *)auVar20,(ulong)(local_108._0_8_ + 1));
                      }
                    }
                    else {
                      local_68 = (local_168.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                 ->og;
                      if ((local_68.obj == 0) ||
                         (cVar12 = std::
                                   _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_a8,&local_68),
                         cVar12._M_node == (_Base_ptr)&_Stack_a0)) goto LAB_001c425d;
                      pmVar13 = std::
                                map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[]((map<QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)local_a8,&local_68);
                      local_118 = (undefined1  [8])(auStack_110 + 8);
                      pcVar3 = (pmVar13->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_118,pcVar3,pcVar3 + pmVar13->_M_string_length);
                      auVar20 = local_118;
                      if ((auStack_110 != (undefined1  [8])p_Var16[1]._M_parent) ||
                         ((auStack_110 != (undefined1  [8])0x0 &&
                          (iVar8 = bcmp((void *)local_118,*(void **)key,(size_t)auStack_110),
                          iVar8 != 0)))) {
                        pmVar14 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                                  ::operator[](local_70,(key_type *)key_00);
                        pmVar15 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator[](pmVar14,(key_type *)key);
                        std::__cxx11::string::_M_assign((string *)pmVar15);
                        auVar20 = local_118;
                      }
                      if (auVar20 != (undefined1  [8])(auStack_110 + 8)) goto LAB_001c431a;
                    }
                    bVar5 = true;
                  }
                }
                else {
                  if ((local_168.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                       (element_type *)0x0) ||
                     (((local_168.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og).obj
                      == 0)) {
                    shallowCopy((QPDFObjectHandle *)local_118);
                    _Var21._M_pi = local_168.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi;
                    local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_118;
                    local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_110;
                    if ((element_type *)_Var21._M_pi != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
                    }
                  }
                  replaceKey(&local_158,(string *)key,&local_168);
                }
                if ((element_type *)
                    local_168.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                    (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_168.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
              } while (p_Var16 != local_38);
            }
            if ((_Base_ptr)
                local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_e8);
            std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_a8);
            _Var21._M_pi = local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi;
            p_Var19 = local_48;
            this = (QPDFObjectHandle *)local_78;
          }
          else {
            bVar5 = isArray(&local_158);
            _Var21._M_pi = local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi;
            if ((bVar5) &&
               (bVar5 = isArray((QPDFObjectHandle *)(local_e0 + 0x28)),
               _Var21._M_pi = local_158.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi, bVar5)) {
              _Stack_a0._M_pi = _Stack_a0._M_pi & 0xffffffff00000000;
              local_98 = (_Base_ptr)0x0;
              local_90 = (QPDFObjGen)&_Stack_a0;
              local_80 = 0;
              local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   local_158.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = local_158.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              if ((element_type *)
                  local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_158.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_158.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_158.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_use_count = (local_158.super_BaseHandle.obj.
                                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_88 = local_90;
              QPDFArrayItems::iterator::iterator
                        ((iterator *)local_e8,(QPDFObjectHandle *)&local_148,true);
              QPDFArrayItems::iterator::iterator
                        ((iterator *)local_118,(QPDFObjectHandle *)&local_148,false);
              do {
                lVar17 = CONCAT44(local_e0._4_4_,local_e0._0_4_);
                do {
                  if (*(int *)(lVar17 + 8) == *(int *)((long)auStack_110 + 8)) {
                    QPDFArrayItems::iterator::~iterator((iterator *)local_118);
                    QPDFArrayItems::iterator::~iterator((iterator *)local_e8);
                    if ((element_type *)
                        local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_148.obj.
                                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         = (element_type *)local_e0._40_8_;
                    local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0;
                    if (local_b0 != (_Base_ptr)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
                        UNLOCK();
                      }
                      else {
                        *(int *)&local_b0->_M_parent = *(int *)&local_b0->_M_parent + 1;
                      }
                    }
                    QPDFArrayItems::iterator::iterator
                              ((iterator *)local_e8,(QPDFObjectHandle *)&local_148,true);
                    QPDFArrayItems::iterator::iterator
                              ((iterator *)local_118,(QPDFObjectHandle *)&local_148,false);
                    goto LAB_001c4509;
                  }
                  QPDFArrayItems::iterator::updateIValue((iterator *)local_e8);
                  local_168.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)local_e0._16_8_;
                  local_168.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_;
                  if ((element_type *)local_e0._24_8_ != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(int *)(local_e0._24_8_ + 8) = *(int *)(local_e0._24_8_ + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(int *)(local_e0._24_8_ + 8) = *(int *)(local_e0._24_8_ + 8) + 1;
                    }
                  }
                  bVar5 = isScalar(&local_168);
                  if (bVar5) {
                    unparse_abi_cxx11_(&local_138,&local_168);
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_a8,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if ((element_type *)
                      local_168.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_168.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  lVar17 = CONCAT44(local_e0._4_4_,local_e0._0_4_);
                } while (*(char *)(lVar17 + 0xc) != '\0');
                *(int *)(lVar17 + 8) = *(int *)(lVar17 + 8) + 1;
                QPDFArrayItems::iterator::updateIValue((iterator *)local_e8);
              } while( true );
            }
          }
        }
        else {
          shallowCopy((QPDFObjectHandle *)local_a8);
          replaceKey(this,(string *)key_00,(QPDFObjectHandle *)local_a8);
          _Var21._M_pi = _Stack_a0._M_pi;
        }
LAB_001c4633:
        if ((element_type *)_Var21._M_pi != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var21._M_pi);
        }
        if (local_b0 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0);
        }
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        psVar23 = local_78;
      } while (p_Var19 != local_40);
    }
    if (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  return;
LAB_001c4509:
  lVar17 = CONCAT44(local_e0._4_4_,local_e0._0_4_);
  do {
    if (*(int *)(lVar17 + 8) == *(int *)((long)auStack_110 + 8)) {
      QPDFArrayItems::iterator::~iterator((iterator *)local_118);
      QPDFArrayItems::iterator::~iterator((iterator *)local_e8);
      if ((_Base_ptr)
          local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      _Var21._M_pi = local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      goto LAB_001c4633;
    }
    QPDFArrayItems::iterator::updateIValue((iterator *)local_e8);
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_e0._16_8_;
    local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._24_8_;
    if ((element_type *)local_e0._24_8_ != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_e0._24_8_ + 8) = *(int *)(local_e0._24_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_e0._24_8_ + 8) = *(int *)(local_e0._24_8_ + 8) + 1;
      }
    }
    bVar5 = isScalar(&local_168);
    if (bVar5) {
      unparse_abi_cxx11_(&local_138,&local_168);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_a8,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if (cVar18._M_node == (_Base_ptr)&_Stack_a0) {
        appendItem(&local_158,&local_168);
      }
    }
    if ((element_type *)
        local_168.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    lVar17 = CONCAT44(local_e0._4_4_,local_e0._0_4_);
  } while (*(char *)(lVar17 + 0xc) != '\0');
  *(int *)(lVar17 + 8) = *(int *)(lVar17 + 8) + 1;
  QPDFArrayItems::iterator::updateIValue((iterator *)local_e8);
  goto LAB_001c4509;
}

Assistant:

void
QPDFObjectHandle::mergeResources(
    QPDFObjectHandle other, std::map<std::string, std::map<std::string, std::string>>* conflicts)
{
    if (!(isDictionary() && other.isDictionary())) {
        QTC::TC("qpdf", "QPDFObjectHandle merge top type mismatch");
        return;
    }

    auto make_og_to_name = [](QPDFObjectHandle& dict,
                              std::map<QPDFObjGen, std::string>& og_to_name) {
        for (auto const& [key, value]: dict.as_dictionary()) {
            if (!value.null() && value.isIndirect()) {
                og_to_name.insert_or_assign(value.getObjGen(), key);
            }
        }
    };

    // This algorithm is described in comments in QPDFObjectHandle.hh
    // above the declaration of mergeResources.
    for (auto const& [rtype, value1]: other.as_dictionary()) {
        auto other_val = value1;
        if (hasKey(rtype)) {
            QPDFObjectHandle this_val = getKey(rtype);
            if (this_val.isDictionary() && other_val.isDictionary()) {
                if (this_val.isIndirect()) {
                    // Do this even if there are no keys. Various places in the code call
                    // mergeResources with resource dictionaries that contain empty subdictionaries
                    // just to get this shallow copy functionality.
                    QTC::TC("qpdf", "QPDFObjectHandle replace with copy");
                    this_val = replaceKeyAndGetNew(rtype, this_val.shallowCopy());
                }
                std::map<QPDFObjGen, std::string> og_to_name;
                std::set<std::string> rnames;
                int min_suffix = 1;
                bool initialized_maps = false;
                for (auto const& [key, value2]: other_val.as_dictionary()) {
                    QPDFObjectHandle rval = value2;
                    if (!this_val.hasKey(key)) {
                        if (!rval.isIndirect()) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge shallow copy");
                            rval = rval.shallowCopy();
                        }
                        this_val.replaceKey(key, rval);
                    } else if (conflicts) {
                        if (!initialized_maps) {
                            make_og_to_name(this_val, og_to_name);
                            rnames = this_val.getResourceNames();
                            initialized_maps = true;
                        }
                        auto rval_og = rval.getObjGen();
                        if (rval.isIndirect() && og_to_name.count(rval_og)) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge reuse");
                            auto new_key = og_to_name[rval_og];
                            if (new_key != key) {
                                (*conflicts)[rtype][key] = new_key;
                            }
                        } else {
                            QTC::TC("qpdf", "QPDFObjectHandle merge generate");
                            std::string new_key =
                                getUniqueResourceName(key + "_", min_suffix, &rnames);
                            (*conflicts)[rtype][key] = new_key;
                            this_val.replaceKey(new_key, rval);
                        }
                    }
                }
            } else if (this_val.isArray() && other_val.isArray()) {
                std::set<std::string> scalars;
                for (auto this_item: this_val.aitems()) {
                    if (this_item.isScalar()) {
                        scalars.insert(this_item.unparse());
                    }
                }
                for (auto other_item: other_val.aitems()) {
                    if (other_item.isScalar()) {
                        if (scalars.count(other_item.unparse()) == 0) {
                            QTC::TC("qpdf", "QPDFObjectHandle merge array");
                            this_val.appendItem(other_item);
                        } else {
                            QTC::TC("qpdf", "QPDFObjectHandle merge array dup");
                        }
                    }
                }
            }
        } else {
            QTC::TC("qpdf", "QPDFObjectHandle merge copy from other");
            replaceKey(rtype, other_val.shallowCopy());
        }
    }
}